

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O0

UBool __thiscall
icu_63::CollationFastLatinBuilder::loadGroups
          (CollationFastLatinBuilder *this,CollationData *data,UErrorCode *errorCode)

{
  UBool UVar1;
  uint32_t uVar2;
  int local_30;
  int32_t i;
  uint32_t r0;
  UErrorCode *errorCode_local;
  CollationData *data_local;
  CollationFastLatinBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    this->headerLength = 5;
    UnicodeString::append(&this->result,(ushort)this->headerLength | 0x200);
    for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
      uVar2 = CollationData::getLastPrimaryForGroup(data,local_30 + 0x1000);
      this->lastSpecialPrimaries[local_30] = uVar2;
      if (this->lastSpecialPrimaries[local_30] == 0) {
        return '\0';
      }
      UnicodeString::append(&this->result,L'\0');
    }
    uVar2 = CollationData::getFirstPrimaryForGroup(data,0x1004);
    this->firstDigitPrimary = uVar2;
    uVar2 = CollationData::getFirstPrimaryForGroup(data,0x19);
    this->firstLatinPrimary = uVar2;
    uVar2 = CollationData::getLastPrimaryForGroup(data,0x19);
    this->lastLatinPrimary = uVar2;
    if ((this->firstDigitPrimary == 0) || (this->firstLatinPrimary == 0)) {
      this_local._7_1_ = '\0';
    }
    else {
      this_local._7_1_ = '\x01';
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool
CollationFastLatinBuilder::loadGroups(const CollationData &data, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return FALSE; }
    headerLength = 1 + NUM_SPECIAL_GROUPS;
    uint32_t r0 = (CollationFastLatin::VERSION << 8) | headerLength;
    result.append((UChar)r0);
    // The first few reordering groups should be special groups
    // (space, punct, ..., digit) followed by Latn, then Grek and other scripts.
    for(int32_t i = 0; i < NUM_SPECIAL_GROUPS; ++i) {
        lastSpecialPrimaries[i] = data.getLastPrimaryForGroup(UCOL_REORDER_CODE_FIRST + i);
        if(lastSpecialPrimaries[i] == 0) {
            // missing data
            return FALSE;
        }
        result.append((UChar)0);  // reserve a slot for this group
    }

    firstDigitPrimary = data.getFirstPrimaryForGroup(UCOL_REORDER_CODE_DIGIT);
    firstLatinPrimary = data.getFirstPrimaryForGroup(USCRIPT_LATIN);
    lastLatinPrimary = data.getLastPrimaryForGroup(USCRIPT_LATIN);
    if(firstDigitPrimary == 0 || firstLatinPrimary == 0) {
        // missing data
        return FALSE;
    }
    return TRUE;
}